

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

aiColor3D __thiscall
Assimp::FBX::FBXConverter::GetColorPropertyFromMaterial
          (FBXConverter *this,PropertyTable *props,string *baseName,bool *result)

{
  bool in_R8B;
  aiColor3D aVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  ai_real aVar1;
  
  std::operator+(&local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result,"Color"
                );
  std::operator+(&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result,
                 "Factor");
  aVar2 = GetColorPropertyFactored
                    (this,(PropertyTable *)result,baseName,&local_40,(bool *)&local_60,in_R8B);
  aVar1 = aVar2.b;
  std::__cxx11::string::~string((string *)&local_60);
  aVar2._0_8_ = std::__cxx11::string::~string((string *)&local_40);
  aVar2.b = aVar1;
  return aVar2;
}

Assistant:

aiColor3D FBXConverter::GetColorPropertyFromMaterial(const PropertyTable& props, const std::string& baseName,
            bool& result)
        {
            return GetColorPropertyFactored(props, baseName + "Color", baseName + "Factor", result, true);
        }